

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

opj_pi_iterator_t * pi_create_decode(opj_image_t *image,opj_cp_t *cp,int tileno)

{
  int iVar1;
  int iVar2;
  int a;
  int b;
  int a_00;
  int a_01;
  int a_02;
  long lVar3;
  opj_pi_comp_t *poVar4;
  uint *puVar5;
  opj_pi_resolution_t *poVar6;
  short *psVar7;
  int in_EDX;
  int iVar8;
  long in_RSI;
  int *in_RDI;
  opj_pi_resolution_t *res;
  int py1;
  int px1;
  int py0;
  int px0;
  int ry1;
  int rx1;
  int ry0;
  int rx0;
  int levelno;
  opj_pi_comp_t *comp;
  int tcy1;
  int tcx1;
  int tcy0;
  int tcx0;
  int maxprec;
  int maxres;
  opj_tccp_t *tccp;
  opj_tcp_t *tcp;
  opj_pi_iterator_t *pi;
  int pino;
  int resno;
  int compno;
  int q;
  int p;
  int local_a0;
  int local_9c;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_50;
  OPJ_UINT32 local_4c;
  int local_30;
  int local_2c;
  int local_28;
  opj_pi_iterator_t *local_8;
  
  lVar3 = *(long *)(in_RSI + 0x80) + (long)in_EDX * 0x15e8;
  local_8 = (opj_pi_iterator_t *)calloc((long)(*(int *)(lVar3 + 0x1a4) + 1),0xf8);
  if (local_8 == (opj_pi_iterator_t *)0x0) {
    local_8 = (opj_pi_iterator_t *)0x0;
  }
  else {
    for (local_30 = 0; local_30 < *(int *)(lVar3 + 0x1a4) + 1; local_30 = local_30 + 1) {
      local_4c = 0;
      local_50 = 0;
      iVar8 = in_EDX % *(int *)(in_RSI + 0x48);
      iVar1 = in_EDX / *(int *)(in_RSI + 0x48);
      iVar2 = int_max(*(int *)(in_RSI + 0x30) + iVar8 * *(int *)(in_RSI + 0x38),*in_RDI);
      local_8[local_30].tx0 = iVar2;
      iVar2 = int_max(*(int *)(in_RSI + 0x34) + iVar1 * *(int *)(in_RSI + 0x3c),in_RDI[1]);
      local_8[local_30].ty0 = iVar2;
      iVar2 = int_min(*(int *)(in_RSI + 0x30) + (iVar8 + 1) * *(int *)(in_RSI + 0x38),in_RDI[2]);
      local_8[local_30].tx1 = iVar2;
      iVar1 = int_min(*(int *)(in_RSI + 0x34) + (iVar1 + 1) * *(int *)(in_RSI + 0x3c),in_RDI[3]);
      local_8[local_30].ty1 = iVar1;
      local_8[local_30].numcomps = in_RDI[4];
      poVar4 = (opj_pi_comp_t *)calloc((ulong)(uint)in_RDI[4],0x18);
      local_8[local_30].comps = poVar4;
      if (local_8[local_30].comps == (opj_pi_comp_t *)0x0) {
        pi_destroy((opj_pi_iterator_t *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (opj_cp_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff74);
        return (opj_pi_iterator_t *)0x0;
      }
      for (local_28 = 0; local_28 < local_8->numcomps; local_28 = local_28 + 1) {
        poVar4 = local_8[local_30].comps + local_28;
        puVar5 = (uint *)(*(long *)(lVar3 + 0x15e0) + (long)local_28 * 0x438);
        poVar4->dx = *(int *)(*(long *)(in_RDI + 6) + (long)local_28 * 0x38);
        poVar4->dy = *(int *)(*(long *)(in_RDI + 6) + (long)local_28 * 0x38 + 4);
        poVar4->numresolutions = puVar5[1];
        poVar6 = (opj_pi_resolution_t *)calloc((long)poVar4->numresolutions,0x10);
        poVar4->resolutions = poVar6;
        if (poVar4->resolutions == (opj_pi_resolution_t *)0x0) {
          pi_destroy((opj_pi_iterator_t *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (opj_cp_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff74);
          return (opj_pi_iterator_t *)0x0;
        }
        iVar1 = int_ceildiv(local_8->tx0,poVar4->dx);
        iVar2 = int_ceildiv(local_8->ty0,poVar4->dy);
        iVar8 = int_ceildiv(local_8->tx1,poVar4->dx);
        a = int_ceildiv(local_8->ty1,poVar4->dy);
        if ((int)local_4c < poVar4->numresolutions) {
          local_4c = poVar4->numresolutions;
        }
        for (local_2c = 0; local_2c < poVar4->numresolutions; local_2c = local_2c + 1) {
          poVar6 = poVar4->resolutions + local_2c;
          if ((*puVar5 & 1) == 0) {
            poVar6->pdx = 0xf;
            poVar6->pdy = 0xf;
          }
          else {
            poVar6->pdx = puVar5[(long)local_2c + 0xcb];
            poVar6->pdy = puVar5[(long)local_2c + 0xec];
          }
          b = (poVar4->numresolutions + -1) - local_2c;
          a_00 = int_ceildivpow2(iVar1,b);
          a_01 = int_ceildivpow2(iVar2,b);
          a_02 = int_ceildivpow2(iVar8,b);
          in_stack_ffffffffffffff84 = int_ceildivpow2(a,b);
          in_stack_ffffffffffffff80 = int_floordivpow2(a_00,poVar6->pdx);
          in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 << ((byte)poVar6->pdx & 0x1f);
          in_stack_ffffffffffffff7c = int_floordivpow2(a_01,poVar6->pdy);
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c << ((byte)poVar6->pdy & 0x1f);
          in_stack_ffffffffffffff78 = int_ceildivpow2(a_02,poVar6->pdx);
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 << ((byte)poVar6->pdx & 0x1f);
          in_stack_ffffffffffffff74 = int_ceildivpow2(in_stack_ffffffffffffff84,poVar6->pdy);
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 << ((byte)poVar6->pdy & 0x1f);
          if (a_00 == a_02) {
            local_9c = 0;
          }
          else {
            local_9c = in_stack_ffffffffffffff78 - in_stack_ffffffffffffff80 >>
                       ((byte)poVar6->pdx & 0x1f);
          }
          poVar6->pw = local_9c;
          if (a_01 == in_stack_ffffffffffffff84) {
            local_a0 = 0;
          }
          else {
            local_a0 = in_stack_ffffffffffffff74 - in_stack_ffffffffffffff7c >>
                       ((byte)poVar6->pdy & 0x1f);
          }
          poVar6->ph = local_a0;
          if (local_50 < poVar6->pw * poVar6->ph) {
            local_50 = poVar6->pw * poVar6->ph;
          }
        }
      }
      local_8[local_30].step_p = 1;
      local_8[local_30].step_c = local_50 * local_8[local_30].step_p;
      local_8[local_30].step_r = in_RDI[4] * local_8[local_30].step_c;
      local_8[local_30].step_l = local_4c * local_8[local_30].step_r;
      if (local_30 == 0) {
        psVar7 = (short *)calloc((ulong)(in_RDI[4] * local_4c * *(int *)(lVar3 + 0xc) * local_50),2)
        ;
        local_8->include = psVar7;
        if (local_8->include == (short *)0x0) {
          pi_destroy((opj_pi_iterator_t *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (opj_cp_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff74);
          return (opj_pi_iterator_t *)0x0;
        }
      }
      else {
        local_8[local_30].include = local_8[local_30 + -1].include;
      }
      if (*(int *)(lVar3 + 0x1a8) == 0) {
        local_8[local_30].first = 1;
        local_8[local_30].poc.resno0 = 0;
        local_8[local_30].poc.compno0 = 0;
        local_8[local_30].poc.layno1 = *(OPJ_UINT32 *)(lVar3 + 0xc);
        local_8[local_30].poc.resno1 = local_4c;
        local_8[local_30].poc.compno1 = in_RDI[4];
        local_8[local_30].poc.prg = *(OPJ_PROG_ORDER *)(lVar3 + 8);
      }
      else {
        local_8[local_30].first = 1;
        local_8[local_30].poc.resno0 = *(OPJ_UINT32 *)(lVar3 + 0x1ac + (long)local_30 * 0x94);
        local_8[local_30].poc.compno0 = *(OPJ_UINT32 *)(lVar3 + (long)local_30 * 0x94 + 0x1b0);
        local_8[local_30].poc.layno1 = *(OPJ_UINT32 *)(lVar3 + (long)local_30 * 0x94 + 0x1b4);
        local_8[local_30].poc.resno1 = *(OPJ_UINT32 *)(lVar3 + (long)local_30 * 0x94 + 0x1b8);
        local_8[local_30].poc.compno1 = *(OPJ_UINT32 *)(lVar3 + (long)local_30 * 0x94 + 0x1bc);
        local_8[local_30].poc.prg = *(OPJ_PROG_ORDER *)(lVar3 + (long)local_30 * 0x94 + 0x1d0);
      }
      local_8[local_30].poc.layno0 = 0;
      local_8[local_30].poc.precno0 = 0;
      local_8[local_30].poc.precno1 = local_50;
    }
  }
  return local_8;
}

Assistant:

opj_pi_iterator_t *pi_create_decode(opj_image_t *image, opj_cp_t *cp, int tileno) {
	int p, q;
	int compno, resno, pino;
	opj_pi_iterator_t *pi = NULL;
	opj_tcp_t *tcp = NULL;
	opj_tccp_t *tccp = NULL;

	tcp = &cp->tcps[tileno];

	pi = (opj_pi_iterator_t*) opj_calloc((tcp->numpocs + 1), sizeof(opj_pi_iterator_t));
	if(!pi) {
		/* TODO: throw an error */
		return NULL;
	}

	for (pino = 0; pino < tcp->numpocs + 1; pino++) {	/* change */
		int maxres = 0;
		int maxprec = 0;
		p = tileno % cp->tw;
		q = tileno / cp->tw;

		pi[pino].tx0 = int_max(cp->tx0 + p * cp->tdx, image->x0);
		pi[pino].ty0 = int_max(cp->ty0 + q * cp->tdy, image->y0);
		pi[pino].tx1 = int_min(cp->tx0 + (p + 1) * cp->tdx, image->x1);
		pi[pino].ty1 = int_min(cp->ty0 + (q + 1) * cp->tdy, image->y1);
		pi[pino].numcomps = image->numcomps;

		pi[pino].comps = (opj_pi_comp_t*) opj_calloc(image->numcomps, sizeof(opj_pi_comp_t));
		if(!pi[pino].comps) {
			/* TODO: throw an error */
			pi_destroy(pi, cp, tileno);
			return NULL;
		}
		
		for (compno = 0; compno < pi->numcomps; compno++) {
			int tcx0, tcy0, tcx1, tcy1;
			opj_pi_comp_t *comp = &pi[pino].comps[compno];
			tccp = &tcp->tccps[compno];
			comp->dx = image->comps[compno].dx;
			comp->dy = image->comps[compno].dy;
			comp->numresolutions = tccp->numresolutions;

			comp->resolutions = (opj_pi_resolution_t*) opj_calloc(comp->numresolutions, sizeof(opj_pi_resolution_t));
			if(!comp->resolutions) {
				/* TODO: throw an error */
				pi_destroy(pi, cp, tileno);
				return NULL;
			}

			tcx0 = int_ceildiv(pi->tx0, comp->dx);
			tcy0 = int_ceildiv(pi->ty0, comp->dy);
			tcx1 = int_ceildiv(pi->tx1, comp->dx);
			tcy1 = int_ceildiv(pi->ty1, comp->dy);
			if (comp->numresolutions > maxres) {
				maxres = comp->numresolutions;
			}

			for (resno = 0; resno < comp->numresolutions; resno++) {
				int levelno;
				int rx0, ry0, rx1, ry1;
				int px0, py0, px1, py1;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				if (tccp->csty & J2K_CCP_CSTY_PRT) {
					res->pdx = tccp->prcw[resno];
					res->pdy = tccp->prch[resno];
				} else {
					res->pdx = 15;
					res->pdy = 15;
				}
				levelno = comp->numresolutions - 1 - resno;
				rx0 = int_ceildivpow2(tcx0, levelno);
				ry0 = int_ceildivpow2(tcy0, levelno);
				rx1 = int_ceildivpow2(tcx1, levelno);
				ry1 = int_ceildivpow2(tcy1, levelno);
				px0 = int_floordivpow2(rx0, res->pdx) << res->pdx;
				py0 = int_floordivpow2(ry0, res->pdy) << res->pdy;
				px1 = int_ceildivpow2(rx1, res->pdx) << res->pdx;
				py1 = int_ceildivpow2(ry1, res->pdy) << res->pdy;
				res->pw = (rx0==rx1)?0:((px1 - px0) >> res->pdx);
				res->ph = (ry0==ry1)?0:((py1 - py0) >> res->pdy);
				
				if (res->pw*res->ph > maxprec) {
					maxprec = res->pw*res->ph;
				}
				
			}
		}
		
		tccp = &tcp->tccps[0];
		pi[pino].step_p = 1;
		pi[pino].step_c = maxprec * pi[pino].step_p;
		pi[pino].step_r = image->numcomps * pi[pino].step_c;
		pi[pino].step_l = maxres * pi[pino].step_r;
		
		if (pino == 0) {
			pi[pino].include = (short int*) opj_calloc(image->numcomps * maxres * tcp->numlayers * maxprec, sizeof(short int));
			if(!pi[pino].include) {
				/* TODO: throw an error */
				pi_destroy(pi, cp, tileno);
				return NULL;
			}
		}
		else {
			pi[pino].include = pi[pino - 1].include;
		}
		
		if (tcp->POC == 0) {
			pi[pino].first = 1;
			pi[pino].poc.resno0 = 0;
			pi[pino].poc.compno0 = 0;
			pi[pino].poc.layno1 = tcp->numlayers;
			pi[pino].poc.resno1 = maxres;
			pi[pino].poc.compno1 = image->numcomps;
			pi[pino].poc.prg = tcp->prg;
		} else {
			pi[pino].first = 1;
			pi[pino].poc.resno0 = tcp->pocs[pino].resno0;
			pi[pino].poc.compno0 = tcp->pocs[pino].compno0;
			pi[pino].poc.layno1 = tcp->pocs[pino].layno1;
			pi[pino].poc.resno1 = tcp->pocs[pino].resno1;
			pi[pino].poc.compno1 = tcp->pocs[pino].compno1;
			pi[pino].poc.prg = tcp->pocs[pino].prg;
		}
		pi[pino].poc.layno0  = 0;
		pi[pino].poc.precno0 = 0; 
		pi[pino].poc.precno1 = maxprec;
			
	}
	
	return pi;
}